

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_pavgb_mips64el(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar1 = 0;
  do {
    vs.ub[lVar1] = (uint8_t)((uint)vs.ub[lVar1] + (uint)vt.ub[lVar1] + 1 >> 1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return vs.d;
}

Assistant:

uint64_t helper_pavgb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; i++) {
        vs.ub[i] = (vs.ub[i] + vt.ub[i] + 1) >> 1;
    }
    return vs.d;
}